

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgvalue.c
# Opt level: O3

mg_map * mg_map_copy_ca(mg_map *map,mg_allocator *allocator)

{
  uint32_t uVar1;
  uint uVar2;
  mg_map *buf;
  mg_string *pmVar3;
  mg_value *pmVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  
  if (map != (mg_map *)0x0) {
    uVar2 = map->size;
    buf = (mg_map *)mg_allocator_malloc(allocator,(ulong)uVar2 * 0x10 + 0x18);
    if (buf != (mg_map *)0x0) {
      buf->keys = (mg_string **)(buf + 1);
      buf->values = (mg_value **)(&buf[1].size + (ulong)uVar2 * 2);
      uVar1 = map->size;
      buf->capacity = uVar1;
      buf->size = uVar1;
      if (uVar1 == 0) {
        return buf;
      }
      uVar7 = 0;
      while( true ) {
        pmVar3 = mg_string_copy_ca(map->keys[uVar7],allocator);
        buf->keys[uVar7] = pmVar3;
        uVar6 = (uint)uVar7;
        uVar2 = uVar6;
        if (buf->keys[uVar7] == (mg_string *)0x0) break;
        pmVar4 = mg_value_copy_ca(map->values[uVar7],allocator);
        buf->values[uVar7] = pmVar4;
        if (buf->values[uVar7] == (mg_value *)0x0) {
          uVar2 = uVar6 + 1;
          break;
        }
        uVar7 = uVar7 + 1;
        if (map->size <= uVar7) {
          return buf;
        }
      }
      if (uVar2 != 0) {
        uVar5 = 0;
        do {
          if (map->keys[uVar5] != (mg_string *)0x0) {
            mg_allocator_free(&mg_system_allocator,map->keys[uVar5]);
          }
          uVar5 = uVar5 + 1;
        } while (uVar2 != uVar5);
      }
      if (uVar6 != 0) {
        uVar5 = 0;
        do {
          if (map->values[uVar5] != (mg_value *)0x0) {
            mg_value_destroy_ca(map->values[uVar5],&mg_system_allocator);
          }
          uVar5 = uVar5 + 1;
        } while (uVar7 != uVar5);
      }
      mg_allocator_free(&mg_system_allocator,buf);
    }
  }
  return (mg_map *)0x0;
}

Assistant:

mg_map *mg_map_copy_ca(const mg_map *map, mg_allocator *allocator) {
  if (!map) {
    return NULL;
  }
  mg_map *nmap = mg_map_alloc(map->size, allocator);
  if (!nmap) {
    return NULL;
  }
  nmap->capacity = map->size;
  nmap->size = map->size;
  uint32_t keys_copied = 0;
  uint32_t values_copied = 0;
  for (uint32_t i = 0; i < map->size; ++i) {
    nmap->keys[i] = mg_string_copy_ca(map->keys[i], allocator);
    if (!nmap->keys[i]) {
      goto cleanup;
    }
    keys_copied++;
    nmap->values[i] = mg_value_copy_ca(map->values[i], allocator);
    if (!nmap->values[i]) {
      goto cleanup;
    }
    values_copied++;
  }
  return nmap;

cleanup:
  for (uint32_t i = 0; i < keys_copied; ++i) {
    mg_string_destroy(map->keys[i]);
  }
  for (uint32_t i = 0; i < values_copied; ++i) {
    mg_value_destroy(map->values[i]);
  }
  mg_allocator_free(&mg_system_allocator, nmap);
  return NULL;
}